

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O0

bool __thiscall
ON_CurveProxy::Evaluate
          (ON_CurveProxy *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  byte local_61;
  int local_58;
  int local_54;
  int i;
  int di;
  int dim;
  bool rc;
  double r;
  double normt;
  int *hint_local;
  double *pdStack_28;
  int side_local;
  double *v_local;
  int v_stride_local;
  int der_count_local;
  double t_local;
  ON_CurveProxy *this_local;
  
  dVar3 = ON_Interval::NormalizedParameterAt(&this->m_this_domain,t);
  if (2.3283064365386963e-10 <= ABS(dVar3)) {
    hint_local._4_4_ = side;
    if (ABS(1.0 - dVar3) < 2.3283064365386963e-10) {
      if (side < 1) {
        side = -side;
      }
      hint_local._4_4_ = 0xfffffffe;
      if (side < 2) {
        hint_local._4_4_ = 0xffffffff;
      }
    }
  }
  else {
    if (side < 1) {
      side = -side;
    }
    hint_local._4_4_ = 2;
    if (side < 2) {
      hint_local._4_4_ = 1;
    }
  }
  if (hint_local._4_4_ != 0) {
    if ((this->m_bReversed & 1U) != 0) {
      hint_local._4_4_ = -hint_local._4_4_;
    }
    if (((this->m_bReversed & 1U) != 0) ||
       (bVar1 = ON_Interval::operator!=(&this->m_real_curve_domain,&this->m_this_domain), bVar1)) {
      if (hint_local._4_4_ == 0xffffffff) {
        hint_local._4_4_ = 0xfffffffe;
      }
      else if (hint_local._4_4_ == 1) {
        hint_local._4_4_ = 2;
      }
    }
  }
  dVar3 = RealCurveParameter(this,t);
  if (this->m_real_curve == (ON_Curve *)0x0) {
    local_61 = 0;
  }
  else {
    iVar2 = (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                      (dVar3,this->m_real_curve,(ulong)(uint)der_count,(ulong)(uint)v_stride,v,
                       (ulong)hint_local._4_4_,hint);
    local_61 = (byte)iVar2;
  }
  if (((bool)(local_61 & 1) != false) && ((this->m_bReversed & 1U) != 0)) {
    iVar2 = (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
    pdStack_28 = v;
    for (local_54 = 1; local_54 <= der_count; local_54 = local_54 + 2) {
      for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
        pdStack_28[(long)v_stride + (long)local_58] = -pdStack_28[(long)v_stride + (long)local_58];
      }
      pdStack_28 = pdStack_28 + (long)v_stride + (long)v_stride;
    }
  }
  return (bool)(local_61 & 1);
}

Assistant:

bool 
ON_CurveProxy::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  // When the proxy domain is a proper subdomain of the 
  // real curve and we are evaluating at the end, we
  // need to be certain we are getting the values
  // from the active part of the curve.
  double normt = m_this_domain.NormalizedParameterAt(t);
  if( fabs( normt )<ON_ZERO_TOLERANCE)
    side = ( std::abs(side) <= 1) ? 1 : 2;
  else if( fabs(1.0 - normt)<ON_ZERO_TOLERANCE)
    side = ( std::abs(side) <= 1) ? -1 : -2;
  
  if ( 0 != side )
  {
    if ( m_bReversed )
    {
      side = -side;
    }
    if (m_bReversed || m_real_curve_domain != m_this_domain )
    {
      // 9 November 2010 Dale Lear - ON_TuneupEvaluationParameter fix
      //  If we have to adjust the evaluation parameter for the 
      //  real curve and the evaluation side was specified, then
      //  set side to +2 or -2 to trigger the use of
      //  ON_TuneupEvaluationParameter() when it matters.
      if ( -1 == side )
        side = -2;
      else if ( 1 == side )
        side = 2;
    }
  }

  double r = RealCurveParameter(t);
  bool rc = ( m_real_curve ) 
          ? m_real_curve->Evaluate( r,der_count,v_stride,v,side,hint) 
          : false;
  if ( rc && m_bReversed ) 
  {
    // negate odd derivatives
    const int dim = m_real_curve->Dimension();
    int di, i;
    for ( di = 1; di <= der_count; di+=2 ) 
    {
      v += v_stride;
      for ( i = 0; i < dim; i++ ) 
      {
        v[i] = -v[i];
      }
      v += v_stride;
    }
  }
  return rc;
}